

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

void __thiscall WSNTopologyBasedEnergy::NodeSentSignalVarPower(WSNTopologyBasedEnergy *this)

{
  int iVar1;
  WSNTopologyBasedEnergy *this_local;
  
  iVar1 = MinMark(this);
  if (iVar1 == 0) {
    TopLayer0SentSink(this);
  }
  else {
    iVar1 = MinMark(this);
    if (iVar1 == 1) {
      TopLayer1SentSink(this);
    }
    else {
      iVar1 = MinMark(this);
      if (iVar1 == 2) {
        TopLayer2SentSink(this);
      }
      else {
        iVar1 = MinMark(this);
        if (iVar1 == 3) {
          TopLayer3SentSink(this);
        }
        else {
          TopLayer4SentSink(this);
        }
      }
    }
  }
  return;
}

Assistant:

void WSNTopologyBasedEnergy::NodeSentSignalVarPower()
{
	if(0==MinMark())
		TopLayer0SentSink();
	else if(1==MinMark())
		TopLayer1SentSink();
	else if(2==MinMark())
		TopLayer2SentSink();
	else if(3==MinMark())
		TopLayer3SentSink();
	else 
		TopLayer4SentSink();

	/*if(0==Mark[0])
	TopLayer0SentSink();
	else if(Mark[0]>=1&&0==Mark[1])
	TopLayer1SentSink();
	else if(Mark[0]>=1&&Mark[1]>=1&&0==Mark[2])
	TopLayer2SentSink();
	else if(Mark[0]>=1&&Mark[1]>=1&&Mark[2]>=1&& 0==Mark[3])
	TopLayer3SentSink();
	else 
	TopLayer4SentSink();*/
}